

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O0

bool __thiscall LinearSystem::Choice(LinearSystem *this,int pos,ChoiceType choice_type)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  Fraction *pFVar4;
  Fraction extraout_RAX;
  double __x;
  double __x_00;
  Fraction local_70;
  Fraction local_68;
  Fraction local_60 [2];
  Fraction local_50;
  int local_48;
  int local_44;
  int column;
  int row;
  Fraction best_item;
  int best_row;
  int best_column;
  int local_28;
  int local_24;
  int max_column;
  int max_row;
  ChoiceType choice_type_local;
  int pos_local;
  LinearSystem *this_local;
  
  local_24 = this->n_;
  local_28 = this->m_;
  max_column = choice_type;
  max_row = pos;
  _choice_type_local = this;
  if (choice_type == Without) {
    pFVar4 = ExtendedMatrix::At(&this->system_,pos,pos);
    Fraction::Fraction((Fraction *)&best_row,0);
    this_local._7_1_ = operator!=(pFVar4,(Fraction *)&best_row);
  }
  else {
    if (choice_type == Row) {
      local_24 = pos + 1;
    }
    else if (choice_type == Column) {
      local_28 = pos + 1;
    }
    best_item.numerator_ = pos;
    best_item.denominator_ = pos;
    pFVar4 = ExtendedMatrix::At(&this->system_,pos,pos);
    _column = *pFVar4;
    for (local_44 = max_row; iVar2 = max_row, iVar1 = best_item.numerator_, local_44 < local_24;
        local_44 = local_44 + 1) {
      for (local_48 = max_row; local_48 < local_28; local_48 = local_48 + 1) {
        ExtendedMatrix::At(&this->system_,local_44,local_48);
        fabs(__x);
        bVar3 = operator<((Fraction *)&column,&local_50);
        if (bVar3) {
          best_item.numerator_ = local_44;
          best_item.denominator_ = local_48;
          ExtendedMatrix::At(&this->system_,local_44,local_48);
          fabs(__x_00);
          _column = extraout_RAX;
        }
      }
    }
    Fraction::Fraction(local_60,0);
    PerformOperation(this,SwapRows,iVar2,iVar1,local_60[0]);
    iVar2 = max_row;
    iVar1 = best_item.denominator_;
    Fraction::Fraction(&local_68,0);
    PerformOperation(this,SwapColumns,iVar2,iVar1,local_68);
    AddMainOutput(this);
    Fraction::Fraction(&local_70,0);
    this_local._7_1_ = operator!=((Fraction *)&column,&local_70);
  }
  return this_local._7_1_;
}

Assistant:

bool LinearSystem::Choice(int pos, Options::ChoiceType choice_type) {
  int max_row = n_, max_column = m_;
  if (choice_type == Options::ChoiceType::Without) {
    return system_.At(pos, pos) != 0;
  } else if (choice_type == Options::ChoiceType::Row) {
    max_row = pos + 1;
  } else if (choice_type == Options::ChoiceType::Column) {
    max_column = pos + 1;
  }

  int best_column = pos, best_row = pos;
  Fraction best_item = system_.At(pos, pos);
  for (int row = pos; row < max_row; ++row) {
    for (int column = pos; column < max_column; ++column) {
      if (best_item < fabs(system_.At(row, column))) {
        best_row = row;
        best_column = column;
        best_item = fabs(system_.At(row, column));
      }
    }
  }

  PerformOperation(OperationType::SwapRows, pos, best_row, 0);
  PerformOperation(OperationType::SwapColumns, pos, best_column, 0);

  AddMainOutput();

  return best_item != 0;
}